

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

double __thiscall r_exec::View::update_vis(View *this)

{
  float fVar1;
  float fVar2;
  Atom local_1c [4];
  
  if ((this->vis_changes != 0) && ((this->acc_vis != 0.0 || (NAN(this->acc_vis))))) {
    fVar1 = (float)r_code::Atom::asFloat();
    fVar1 = fVar1 + this->acc_vis / (float)this->vis_changes;
    fVar2 = 0.0;
    if ((0.0 <= fVar1) && (fVar2 = fVar1, 1.0 < fVar1)) {
      fVar2 = 1.0;
    }
    r_code::Atom::Float(fVar2);
    r_code::Atom::operator=((Atom *)&(this->super_View).field_0x48,local_1c);
    r_code::Atom::~Atom(local_1c);
  }
  this->acc_vis = 0.0;
  this->vis_changes = 0;
  fVar2 = (float)r_code::Atom::asFloat();
  return (double)fVar2;
}

Assistant:

double View::update_vis()
{
    if (vis_changes > 0 && acc_vis != 0) {
        double new_vis = get_vis() + acc_vis / vis_changes;

        if (new_vis < 0) {
            new_vis = 0;
        } else if (new_vis > 1) {
            new_vis = 1;
        }

        code(GRP_VIEW_VIS) = r_code::Atom::Float(new_vis);
    }

    acc_vis = 0;
    vis_changes = 0;
    return get_vis();
}